

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O0

void inject_activation_handler(int code,siginfo_t *siginfo,void *context)

{
  int iVar1;
  long lVar2;
  PAL_SafeActivationCheckFunction p_Var3;
  __pid_t _Var4;
  BOOL BVar5;
  DWORD64 DVar6;
  long in_FS_OFFSET;
  native_context_t *ucontext;
  void *context_local;
  siginfo_t *siginfo_local;
  undefined1 local_4e8 [4];
  int code_local;
  CONTEXT winContext;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (siginfo->_sifields)._pad[0];
  _Var4 = getpid();
  if ((iVar1 == _Var4) && (g_activationFunction != (PAL_ActivationFunction)0x0)) {
    if (g_safeActivationCheckFunction == (PAL_SafeActivationCheckFunction)0x0) {
      fprintf(_stderr,"] %s %s:%d","inject_activation_handler",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/exception/signal.cpp"
              ,0x1b4);
      fprintf(_stderr,"Expression: g_safeActivationCheckFunction != NULL\n");
    }
    CONTEXTFromNativeContext((native_context_t *)context,(LPCONTEXT)local_4e8,0x10000b);
    p_Var3 = g_safeActivationCheckFunction;
    DVar6 = CONTEXTGetPC((LPCONTEXT)local_4e8);
    BVar5 = (*p_Var3)(DVar6,1);
    if (BVar5 != 0) {
      (*g_activationFunction)((CONTEXT *)local_4e8);
    }
    CONTEXTToNativeContext((CONTEXT *)local_4e8,(native_context_t *)context);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void inject_activation_handler(int code, siginfo_t *siginfo, void *context)
{
    // Only accept activations from the current process
    if (siginfo->si_pid == getpid())
    {
        if (g_activationFunction != NULL)
        {
            _ASSERTE(g_safeActivationCheckFunction != NULL);

            native_context_t *ucontext = (native_context_t *)context;

            CONTEXT winContext;
            CONTEXTFromNativeContext(
                ucontext,
                &winContext,
                CONTEXT_CONTROL | CONTEXT_INTEGER | CONTEXT_FLOATING_POINT);

            if (g_safeActivationCheckFunction(CONTEXTGetPC(&winContext), true))
            {
                g_activationFunction(&winContext);
            }

            // Activation function may have modified the context, so update it.
            CONTEXTToNativeContext(&winContext, ucontext);
        }
    }
}